

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O0

int amqp_time_tv_until(amqp_time_t time,timeval *in,timeval **out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  undefined8 *in_RDX;
  long *in_RSI;
  ulong in_RDI;
  uint64_t delta_ns;
  uint64_t now_ns;
  int local_4;
  
  if (in_RDI == 0xffffffffffffffff) {
    *in_RDX = 0;
    local_4 = 0;
  }
  else if (in_RDI == 0) {
    *in_RSI = 0;
    in_RSI[1] = 0;
    *in_RDX = in_RSI;
    local_4 = 0;
  }
  else {
    uVar3 = amqp_get_monotonic_timestamp();
    if (uVar3 == 0) {
      local_4 = -0xe;
    }
    else if (uVar3 < in_RDI) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDI - uVar3;
      *in_RSI = (long)SUB164(auVar1 / ZEXT816(1000000000),0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (in_RDI - uVar3) % 1000000000;
      in_RSI[1] = (long)SUB164(auVar2 / ZEXT816(1000),0);
      *in_RDX = in_RSI;
      local_4 = 0;
    }
    else {
      *in_RSI = 0;
      in_RSI[1] = 0;
      *in_RDX = in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int amqp_time_tv_until(amqp_time_t time, struct timeval *in,
                       struct timeval **out) {
  uint64_t now_ns;
  uint64_t delta_ns;

  assert(in != NULL);
  if (UINT64_MAX == time.time_point_ns) {
    *out = NULL;
    return AMQP_STATUS_OK;
  }
  if (0 == time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns >= time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  delta_ns = time.time_point_ns - now_ns;
  in->tv_sec = (int)(delta_ns / AMQP_NS_PER_S);
  in->tv_usec = (int)((delta_ns % AMQP_NS_PER_S) / AMQP_NS_PER_US);
  *out = in;

  return AMQP_STATUS_OK;
}